

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_index_meta(jit_State *J,CTState *cts,CType *ct,RecordFFData *rd)

{
  undefined2 uVar1;
  undefined4 uVar2;
  TRef TVar3;
  cTValue *o_00;
  cTValue *J_00;
  jit_State *in_RCX;
  cTValue *in_RDX;
  GCtab *in_RSI;
  lua_State *in_RDI;
  cTValue *o;
  cTValue *tv;
  CTypeID id;
  undefined8 in_stack_ffffffffffffffa8;
  TraceError e;
  undefined6 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb6;
  RecordFFData *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  
  uVar2 = (undefined4)((long)in_RDX - *(long *)in_RSI >> 4);
  o_00 = lj_ctype_meta((CTState *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                       (CTypeID)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                       (MMS)in_stack_ffffffffffffffc0);
  e = (TraceError)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (o_00 == (cTValue *)0x0) {
    lj_trace_err((jit_State *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),e);
  }
  if ((o_00->field_2).it == 0xfffffff7) {
    crec_tailcall((jit_State *)&o_00->field_2,in_stack_ffffffffffffffb8,
                  (cTValue *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0));
  }
  else {
    if (((*(int *)&(in_RCX->cur).ir != 0) || ((o_00->field_2).it != 0xfffffff4)) ||
       ((*(uint *)(*(long *)&in_RDI[2].glref + 4) & 0x1f000000) != 0x4000000)) {
      lj_trace_err((jit_State *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),e);
    }
    J_00 = lj_tab_get(in_RDI,in_RSI,in_RDX);
    TVar3 = lj_record_constify((jit_State *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),o_00);
    **(TRef **)&in_RDI[2].glref = TVar3;
    if (**(int **)&in_RDI[2].glref == 0) {
      lj_trace_err((jit_State *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),e);
    }
    uVar1 = (undefined2)*(undefined4 *)(*(long *)&in_RDI[2].glref + 4);
    TVar3 = lj_ir_kgc(in_RCX,(GCobj *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                      (IRType)((ulong)o_00 >> 0x20));
    *(undefined2 *)&in_RDI[2].stack.ptr32 = 0x884;
    *(undefined2 *)&in_RDI[2].maxstack.ptr32 = uVar1;
    *(short *)((long)&in_RDI[2].maxstack.ptr32 + 2) = (short)TVar3;
    lj_opt_fold((jit_State *)&J_00->field_2);
  }
  return;
}

Assistant:

static void crec_index_meta(jit_State *J, CTState *cts, CType *ct,
			    RecordFFData *rd)
{
  CTypeID id = ctype_typeid(cts, ct);
  cTValue *tv = lj_ctype_meta(cts, id, rd->data ? MM_newindex : MM_index);
  if (!tv)
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  if (tvisfunc(tv)) {
    crec_tailcall(J, rd, tv);
  } else if (rd->data == 0 && tvistab(tv) && tref_isstr(J->base[1])) {
    /* Specialize to result of __index lookup. */
    cTValue *o = lj_tab_get(J->L, tabV(tv), &rd->argv[1]);
    J->base[0] = lj_record_constify(J, o);
    if (!J->base[0])
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    /* Always specialize to the key. */
    emitir(IRTG(IR_EQ, IRT_STR), J->base[1], lj_ir_kstr(J, strV(&rd->argv[1])));
  } else {
    /* NYI: resolving of non-function metamethods. */
    /* NYI: non-string keys for __index table. */
    /* NYI: stores to __newindex table. */
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
}